

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O1

int cJSONUtils_ApplyPatches(cJSON *object,cJSON *patches)

{
  int iVar1;
  cJSON *patch;
  
  iVar1 = cJSON_IsArray(patches);
  if (iVar1 == 0) {
    iVar1 = 1;
  }
  else {
    iVar1 = 0;
    if (patches == (cJSON *)0x0) {
      patch = (cJSON *)0x0;
    }
    else {
      patch = patches->child;
    }
    if (patch != (cJSON *)0x0) {
      do {
        iVar1 = apply_patch(object,patch,0);
        if (iVar1 != 0) {
          return iVar1;
        }
        patch = patch->next;
      } while (patch != (cJSON *)0x0);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

CJSON_PUBLIC(int) cJSONUtils_ApplyPatches(cJSON * const object, const cJSON * const patches)
{
    const cJSON *current_patch = NULL;
    int status = 0;

    if (!cJSON_IsArray(patches))
    {
        /* malformed patches. */
        return 1;
    }

    if (patches != NULL)
    {
        current_patch = patches->child;
    }

    while (current_patch != NULL)
    {
        status = apply_patch(object, current_patch, false);
        if (status != 0)
        {
            return status;
        }
        current_patch = current_patch->next;
    }

    return 0;
}